

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O3

void __thiscall
TPZSkylMatrix<std::complex<double>_>::SolveSOR
          (TPZSkylMatrix<std::complex<double>_> *this,int64_t *numiterations,
          TPZFMatrix<std::complex<double>_> *F,TPZFMatrix<std::complex<double>_> *result,
          TPZFMatrix<std::complex<double>_> *residual,TPZFMatrix<std::complex<double>_> *scratch,
          REAL overrelax,REAL *tol,int FromCurrent,int direction)

{
  double *pdVar1;
  complex<double> **ppcVar2;
  complex<double> *pcVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double dVar7;
  TPZFMatrix<std::complex<double>_> *pTVar8;
  int iVar9;
  undefined4 extraout_var;
  long lVar10;
  long lVar11;
  complex<double> *pcVar12;
  undefined1 (*pauVar13) [16];
  long lVar14;
  long lVar15;
  double *pdVar16;
  complex<double> *pcVar17;
  complex<double> *__z;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar18;
  double dVar19;
  double dVar20;
  undefined8 uVar21;
  complex<double> over;
  long local_130;
  double local_128;
  double dStack_120;
  TPZSkylMatrix<std::complex<double>_> *local_110;
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  long local_e8;
  TPZFMatrix<std::complex<double>_> *local_e0;
  double local_d8;
  double local_d0;
  TPZFMatrix<std::complex<double>_> *local_c8;
  long local_c0;
  int local_b4;
  long local_b0;
  double *local_a8;
  TPZFMatrix<std::complex<double>_> *local_a0;
  long *local_98;
  long local_90;
  int64_t local_88;
  long local_80;
  complex<double> *local_78;
  undefined8 uStack_70;
  double local_68;
  TPZFMatrix<std::complex<double>_> *local_58;
  long local_50;
  long local_48;
  REAL local_40;
  double dStack_38;
  
  local_108._8_8_ = local_108._0_8_;
  local_110 = this;
  local_a0 = F;
  local_98 = numiterations;
  if (residual == F) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "TPZMatrix::SolveSOR called with residual and F equal, no solution\n",0x42);
    return;
  }
  local_b4 = direction;
  local_a8 = tol;
  local_58 = residual;
  if (residual == (TPZFMatrix<std::complex<double>_> *)0x0) {
    local_108._0_8_ = *tol + *tol + 1.0;
  }
  else {
    Dot<std::complex<double>>(residual,residual);
    if ((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da) < 0.0) {
      local_108._0_8_ = sqrt((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
    }
    else {
      local_108._0_8_ = SQRT((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
    }
  }
  if (FromCurrent == 0) {
    (*(result->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
      _vptr_TPZSavable[0xf])(result);
  }
  dStack_38 = 0.0;
  local_40 = overrelax;
  iVar9 = (*(local_110->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable
            ._vptr_TPZSavable[0xc])();
  lVar15 = 0;
  local_c0 = CONCAT44(extraout_var,iVar9) + -1;
  local_e8 = lVar15;
  if (local_b4 != -1) {
    local_c0 = lVar15;
    local_e8 = CONCAT44(extraout_var,iVar9);
  }
  dVar20 = (double)local_108._0_8_;
  if ((0 < *local_98) &&
     (*local_a8 <= (double)local_108._0_8_ && (double)local_108._0_8_ != *local_a8)) {
    local_88 = (local_a0->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol;
    local_b0 = (ulong)(local_b4 != -1) * 2 + -1;
    local_50 = local_c0 * 0x10 + 0x10;
    local_48 = local_b0 * 0x10;
    lVar15 = 0;
    local_e0 = result;
    local_c8 = scratch;
    do {
      local_90 = lVar15;
      TPZFMatrix<std::complex<double>_>::operator=(scratch,local_a0);
      local_d0 = 0.0;
      if (0 < local_88) {
        local_d0 = 0.0;
        local_80 = 0;
        local_130 = 0;
        do {
          if (local_b4 == 1) {
            local_108._0_8_ = local_50;
            lVar15 = local_c0;
            result = local_e0;
            if (local_c0 != local_e8) {
              do {
                ppcVar2 = (local_110->fElem).fStore;
                local_d8 = (double)((long)ppcVar2[lVar15 + 1] - (long)ppcVar2[lVar15] >> 4);
                local_f8 = ZEXT816(0);
                if (((lVar15 - (long)local_d8 < -1) ||
                    (lVar14 = (local_c8->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix
                              .fRow, lVar14 <= (lVar15 - (long)local_d8) + 1)) ||
                   ((local_c8->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol <=
                    local_130)) {
                  TPZFMatrix<std::complex<double>_>::Error
                            ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                if (((lVar15 < 0) ||
                    (lVar11 = (local_e0->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix
                              .fRow, lVar11 <= lVar15)) ||
                   ((local_e0->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol <=
                    local_130)) {
                  TPZFMatrix<std::complex<double>_>::Error
                            ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                local_f8 = *(undefined1 (*) [16])
                            local_e0->fElem[lVar11 * local_130 + lVar15]._M_value;
                pdVar16 = (double *)
                          ((long)(local_110->fElem).fStore[lVar15] +
                          ((long)ppcVar2[lVar15 + 1] - (long)ppcVar2[lVar15]) + -0x10);
                lVar11 = (long)pdVar16 - (long)ppcVar2[lVar15] >> 4;
                if (-1 < lVar11) {
                  lVar11 = lVar11 + 1;
                  pauVar13 = (undefined1 (*) [16])
                             (local_c8->fElem[-(long)local_d8]._M_value +
                             lVar14 * local_80 + local_108._0_8_);
                  do {
                    local_128 = *pdVar16;
                    dStack_120 = pdVar16[1];
                    std::complex<double>::operator*=
                              ((complex<double> *)&local_128,(complex<double> *)local_f8);
                    dVar20 = *(double *)(*pauVar13 + 8) - dStack_120;
                    auVar4._8_4_ = SUB84(dVar20,0);
                    auVar4._0_8_ = *(double *)*pauVar13 - local_128;
                    auVar4._12_4_ = (int)((ulong)dVar20 >> 0x20);
                    *pauVar13 = auVar4;
                    pauVar13 = pauVar13 + 1;
                    pdVar16 = pdVar16 + -2;
                    lVar11 = lVar11 + -1;
                  } while (lVar11 != 0);
                }
                lVar15 = lVar15 + local_b0;
                local_108._0_8_ = local_108._0_8_ + local_48;
              } while (lVar15 != local_e8);
              lVar15 = local_c0;
              result = local_e0;
              if (local_c0 != local_e8) {
                do {
                  ppcVar2 = (local_110->fElem).fStore;
                  lVar14 = (long)ppcVar2[lVar15 + 1] - (long)ppcVar2[lVar15];
                  if (((lVar15 < 0) ||
                      (lVar11 = (local_c8->super_TPZMatrix<std::complex<double>_>).
                                super_TPZBaseMatrix.fRow, lVar11 <= lVar15)) ||
                     ((local_c8->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol <=
                      local_130)) {
                    TPZFMatrix<std::complex<double>_>::Error
                              ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                    pzinternal::DebugStopImpl
                              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                               ,0x26d);
                  }
                  local_108._0_8_ = lVar15 * 0x10;
                  local_f8 = *(undefined1 (*) [16])
                              local_c8->fElem[lVar11 * local_130 + lVar15]._M_value;
                  lVar11 = (lVar15 - (lVar14 >> 4)) + 1;
                  if (((lVar15 - (lVar14 >> 4) < -1) ||
                      (lVar10 = (result->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix
                                .fRow, lVar10 <= lVar11)) ||
                     ((result->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol <=
                      local_130)) {
                    TPZFMatrix<std::complex<double>_>::Error
                              ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                    pzinternal::DebugStopImpl
                              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                               ,0x26d);
                  }
                  pcVar3 = (local_110->fElem).fStore[lVar15];
                  pcVar12 = (complex<double> *)(lVar14 + -0x10 + (long)pcVar3);
                  if (pcVar3 < pcVar12) {
                    __z = result->fElem + lVar10 * local_130 + lVar11;
                    do {
                      pcVar17 = pcVar12;
                      local_128 = *(double *)pcVar17->_M_value;
                      dStack_120 = *(double *)(pcVar17->_M_value + 8);
                      std::complex<double>::operator*=((complex<double> *)&local_128,__z);
                      dStack_120 = (double)local_f8._8_8_ - dStack_120;
                      local_f8._8_4_ = SUB84(dStack_120,0);
                      local_f8._0_8_ = (double)local_f8._0_8_ - local_128;
                      local_f8._12_4_ = (int)((ulong)dStack_120 >> 0x20);
                      pcVar12 = pcVar17 + -1;
                      __z = __z + 1;
                      result = local_e0;
                    } while (pcVar3 < pcVar12);
                  }
                  else {
                    pcVar17 = (complex<double> *)((long)pcVar3 + lVar14);
                  }
                  local_128 = (double)local_f8._0_8_;
                  dStack_120 = (double)local_f8._8_8_;
                  std::complex<double>::operator*=
                            ((complex<double> *)&local_128,(complex<double> *)local_f8);
                  local_d8 = cabs(local_128);
                  local_128 = (double)local_f8._0_8_;
                  dStack_120 = (double)local_f8._8_8_;
                  std::complex<double>::operator*=
                            ((complex<double> *)&local_128,(complex<double> *)&local_40);
                  uVar21 = 0;
                  dVar19 = dStack_120;
                  dVar20 = (double)__divdc3(SUB84(local_128,0),dStack_120,
                                            *(undefined8 *)pcVar12->_M_value,
                                            *(undefined8 *)(pcVar17[-1]._M_value + 8));
                  if (((lVar15 < 0) ||
                      (lVar14 = (result->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix
                                .fRow, lVar14 <= lVar15)) ||
                     ((result->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol <=
                      local_130)) {
                    local_78 = (complex<double> *)dVar19;
                    uStack_70 = uVar21;
                    local_68 = dVar20;
                    TPZFMatrix<std::complex<double>_>::Error
                              ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                    pzinternal::DebugStopImpl
                              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                               ,0x26d);
                  }
                  local_d0 = local_d0 + local_d8;
                  lVar14 = lVar14 * local_130;
                  pdVar16 = (double *)(result->fElem[lVar14]._M_value + local_108._0_8_);
                  dVar7 = pdVar16[1];
                  pdVar1 = (double *)(result->fElem[lVar14]._M_value + local_108._0_8_);
                  *pdVar1 = dVar20 + *pdVar16;
                  pdVar1[1] = dVar19 + dVar7;
                  lVar15 = lVar15 + local_b0;
                } while (lVar15 != local_e8);
              }
            }
          }
          else {
            lVar15 = local_c0;
            if (local_c0 != local_e8) {
              do {
                ppcVar2 = (local_110->fElem).fStore;
                lVar14 = (long)ppcVar2[lVar15 + 1] - (long)ppcVar2[lVar15];
                if (((lVar15 < 0) ||
                    (lVar11 = (scratch->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.
                              fRow, lVar11 <= lVar15)) ||
                   ((scratch->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol <=
                    local_130)) {
                  TPZFMatrix<std::complex<double>_>::Error
                            ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                lVar10 = lVar14 >> 4;
                local_d8 = (double)(lVar15 * 0x10);
                pcVar3 = scratch->fElem + lVar11 * local_130 + lVar15;
                dVar20 = *(double *)pcVar3->_M_value;
                dVar19 = *(double *)(pcVar3->_M_value + 8);
                lVar11 = (lVar15 - lVar10) + 1;
                if (((lVar15 - lVar10 < -1) ||
                    (lVar10 = (result->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.
                              fRow, lVar10 <= lVar11)) ||
                   ((result->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol <=
                    local_130)) {
                  local_108 = *(undefined1 (*) [16])pcVar3->_M_value;
                  TPZFMatrix<std::complex<double>_>::Error
                            ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                pcVar3 = (local_110->fElem).fStore[lVar15];
                pcVar12 = (complex<double> *)((long)pcVar3 + lVar14 + -0x10);
                if (pcVar3 < pcVar12) {
                  pcVar17 = local_e0->fElem + lVar10 * local_130 + lVar11;
                  do {
                    local_108._8_4_ = SUB84(dVar19,0);
                    local_108._0_8_ = dVar20;
                    local_108._12_4_ = (int)((ulong)dVar19 >> 0x20);
                    local_128 = *(double *)pcVar12->_M_value;
                    dStack_120 = *(double *)(pcVar12->_M_value + 8);
                    std::complex<double>::operator*=((complex<double> *)&local_128,pcVar17);
                    dVar20 = (double)local_108._0_8_ - local_128;
                    dVar19 = (double)local_108._8_8_ - dStack_120;
                    pcVar12 = pcVar12 + -1;
                    pcVar17 = pcVar17 + 1;
                  } while (pcVar3 < pcVar12);
                }
                uVar18 = (undefined4)((ulong)dVar19 >> 0x20);
                if (((lVar15 < 0) ||
                    (lVar14 = (local_c8->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix
                              .fRow, lVar14 <= lVar15)) ||
                   ((local_c8->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol <=
                    local_130)) {
                  local_108._8_4_ = SUB84(dVar19,0);
                  local_108._0_8_ = dVar20;
                  local_108._12_4_ = uVar18;
                  TPZFMatrix<std::complex<double>_>::Error
                            ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                auVar5._8_4_ = SUB84(dVar19,0);
                auVar5._0_8_ = dVar20;
                auVar5._12_4_ = uVar18;
                *(undefined1 (*) [16])
                 (local_c8->fElem[lVar14 * local_130]._M_value + (long)local_d8) = auVar5;
                lVar15 = lVar15 + local_b0;
                scratch = local_c8;
                result = local_e0;
              } while (lVar15 != local_e8);
              lVar15 = local_c0;
              if (local_c0 != local_e8) {
                do {
                  ppcVar2 = (local_110->fElem).fStore;
                  pcVar3 = ppcVar2[lVar15];
                  local_d8 = (double)((long)ppcVar2[lVar15 + 1] - (long)pcVar3);
                  lVar10 = (lVar15 - ((long)local_d8 >> 4)) + 1;
                  lVar14 = (local_c8->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.
                           fRow;
                  lVar11 = (local_c8->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.
                           fCol;
                  if ((lVar11 <= local_130 || lVar15 - ((long)local_d8 >> 4) < -1) ||
                      lVar14 <= lVar10) {
                    TPZFMatrix<std::complex<double>_>::Error
                              ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                    pzinternal::DebugStopImpl
                              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                               ,0x26d);
                  }
                  pcVar12 = local_c8->fElem;
                  local_108._0_8_ = lVar14 * local_130;
                  if (((lVar15 < 0) || (lVar14 <= lVar15)) || (lVar11 <= local_130)) {
                    TPZFMatrix<std::complex<double>_>::Error
                              ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                    pzinternal::DebugStopImpl
                              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                               ,0x26d);
                  }
                  local_f8._0_8_ = *(undefined8 *)pcVar12[lVar14 * local_130 + lVar15]._M_value;
                  local_f8._8_8_ =
                       *(undefined8 *)(pcVar12[lVar14 * local_130 + lVar15]._M_value + 8);
                  local_78 = pcVar12;
                  if (((lVar15 < 0) ||
                      (lVar14 = (local_e0->super_TPZMatrix<std::complex<double>_>).
                                super_TPZBaseMatrix.fRow, lVar14 <= lVar15)) ||
                     ((local_e0->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol <=
                      local_130)) {
                    TPZFMatrix<std::complex<double>_>::Error
                              ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                    pzinternal::DebugStopImpl
                              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                               ,0x26d);
                  }
                  local_128 = *(double *)pcVar3->_M_value;
                  dStack_120 = *(double *)(pcVar3->_M_value + 8);
                  std::complex<double>::operator*=
                            ((complex<double> *)&local_128,
                             local_e0->fElem + lVar14 * local_130 + lVar15);
                  local_128 = (double)local_f8._0_8_ - local_128;
                  dStack_120 = (double)local_f8._8_8_ - dStack_120;
                  local_f8._8_4_ = SUB84(dStack_120,0);
                  local_f8._0_8_ = local_128;
                  local_f8._12_4_ = (int)((ulong)dStack_120 >> 0x20);
                  dStack_120 = (double)local_f8._8_8_;
                  std::complex<double>::operator*=
                            ((complex<double> *)&local_128,(complex<double> *)local_f8);
                  local_68 = cabs(local_128);
                  pTVar8 = local_e0;
                  local_128 = local_40;
                  dStack_120 = dStack_38;
                  std::complex<double>::operator*=
                            ((complex<double> *)&local_128,(complex<double> *)local_f8);
                  dVar20 = dStack_120;
                  local_f8._0_8_ =
                       __divdc3(SUB84(local_128,0),dStack_120,*(undefined8 *)pcVar3->_M_value,
                                *(undefined8 *)(pcVar3->_M_value + 8));
                  local_f8._8_8_ = dVar20;
                  if (((lVar15 < 0) ||
                      (lVar14 = (pTVar8->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix
                                .fRow, lVar14 <= lVar15)) ||
                     ((pTVar8->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol <=
                      local_130)) {
                    TPZFMatrix<std::complex<double>_>::Error
                              ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                    pzinternal::DebugStopImpl
                              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                               ,0x26d);
                  }
                  lVar14 = lVar14 * local_130;
                  pcVar12 = pTVar8->fElem + lVar14 + lVar15;
                  dVar19 = *(double *)(pcVar12->_M_value + 8);
                  pcVar17 = pTVar8->fElem + lVar14 + lVar15;
                  *(double *)pcVar17->_M_value =
                       *(double *)pcVar12->_M_value + (double)local_f8._0_8_;
                  *(double *)(pcVar17->_M_value + 8) = dVar19 + dVar20;
                  if (((lVar15 < 0) ||
                      (lVar14 = (pTVar8->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix
                                .fRow, lVar14 <= lVar15)) ||
                     ((pTVar8->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol <=
                      local_130)) {
                    TPZFMatrix<std::complex<double>_>::Error
                              ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                    pzinternal::DebugStopImpl
                              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                               ,0x26d);
                  }
                  local_f8 = *(undefined1 (*) [16])
                              pTVar8->fElem[lVar14 * local_130 + lVar15]._M_value;
                  pcVar12 = (complex<double> *)
                            ((local_110->fElem).fStore[lVar15][-1]._M_value + (long)local_d8);
                  if (pcVar3 < pcVar12) {
                    pcVar17 = local_78 + local_108._0_8_ + lVar10;
                    do {
                      local_128 = *(double *)pcVar12->_M_value;
                      dStack_120 = *(double *)(pcVar12->_M_value + 8);
                      std::complex<double>::operator*=
                                ((complex<double> *)&local_128,(complex<double> *)local_f8);
                      dVar20 = *(double *)(pcVar17->_M_value + 8) - dStack_120;
                      auVar6._8_4_ = SUB84(dVar20,0);
                      auVar6._0_8_ = *(double *)pcVar17->_M_value - local_128;
                      auVar6._12_4_ = (int)((ulong)dVar20 >> 0x20);
                      *(undefined1 (*) [16])pcVar17->_M_value = auVar6;
                      pcVar17 = pcVar17 + 1;
                      pcVar12 = pcVar12 + -1;
                    } while (pcVar3 < pcVar12);
                  }
                  local_d0 = local_d0 + local_68;
                  lVar15 = lVar15 + local_b0;
                  result = local_e0;
                } while (lVar15 != local_e8);
              }
            }
          }
          local_130 = local_130 + 1;
          local_80 = local_80 + 0x10;
          scratch = local_c8;
        } while (local_130 != local_88);
      }
      if (local_d0 < 0.0) {
        dVar20 = sqrt(local_d0);
      }
      else {
        dVar20 = SQRT(local_d0);
      }
      lVar15 = local_90 + 1;
    } while ((lVar15 < *local_98) && (*local_a8 <= dVar20 && dVar20 != *local_a8));
  }
  local_108._0_8_ = dVar20;
  if (local_58 != (TPZFMatrix<std::complex<double>_> *)0x0) {
    (*(local_110->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
      _vptr_TPZSavable[0x28])(local_110,result,local_a0);
  }
  *local_98 = lVar15;
  *local_a8 = (double)local_108._0_8_;
  return;
}

Assistant:

void TPZSkylMatrix<TVar>::SolveSOR(int64_t & numiterations,const TPZFMatrix<TVar> &F,
                                   TPZFMatrix<TVar> &result, TPZFMatrix<TVar> *residual, TPZFMatrix<TVar> &scratch,const REAL overrelax,
                                   REAL &tol,const int FromCurrent,const int direction)  {
	
	if(residual == &F) {
		cout << "TPZMatrix::SolveSOR called with residual and F equal, no solution\n";
		return;
	}
	REAL res = 2.*tol+1.;
	if(residual) res = Norm(*residual);
	if(!FromCurrent) {
		result.Zero();
	}
    TVar over = overrelax;
	int64_t r = this->Dim();
	int64_t c = F.Cols();
	int64_t i,ifirst = 0, ilast = r, iinc = 1;
	if(direction == -1) {
		ifirst = r-1;
		ilast = 0;
		iinc = -1;
	}
	int64_t it;
	for(it=0; it<numiterations && res > tol; it++) {
		res = 0.;
		scratch = F;
		for(int64_t ic=0; ic<c; ic++) {
			if(direction == 1) {
				//
				// compute the upper triangular part first and put into the scractch vector
				//
				for(i=ifirst; i!=ilast; i+= iinc) {
					//TPZColuna *mydiag = &fDiag[i];
					int64_t offset = Size(i);
					TVar val;
					TVar *diag;
					TVar *diaglast = fElem[i];
					TVar *scratchp = &scratch(i-offset+1,ic);
					val = result(i,ic);
					diag = fElem[i] + offset-1;
					int64_t lastid = diag-diaglast;
					int64_t id;
					for(id=0; id<=lastid; id++) *(scratchp+id) -= *(diag-id) * val;
					/* codeguard fix
					 while( diag >= diaglast ) *scratchp++ -= *diag-- * val;
					 */
				}
				//
				// perform the SOR operation
				//
				for(i=ifirst; i!=ilast; i+= iinc) {
					//TPZColuna *mydiag = &fDiag[i];
					int64_t offset = Size(i);
					TVar val = scratch(i,ic);
					TVar *p = &result(i-offset+1,ic);
					TVar *diag = fElem[i] + offset-1;
					TVar *diaglast = fElem[i];
					while( diag > diaglast ) val -= *diag-- * *p++;
					res += abs(val*val);
					result(i,ic) += val*over/ (*diag);
				}
			} else {
				//
				// the direction is upward
				//
				// put the lower triangular part of the multiplication into the scratch vector
				//
				for(i=ifirst; i!=ilast; i+= iinc) {
					//TPZColuna *mydiag = &fDiag[i];
					int64_t offset = Size(i);
					TVar val = scratch(i,ic);
					TVar *p = &result(i-offset+1,ic);
					TVar *diag = fElem[i] + offset-1;
					TVar *diaglast = fElem[i];
					while( diag > diaglast ) val -= *diag-- * *p++;
					//					res += val*val;
					scratch(i,ic) = val;
				}
				//
				// perform the SOR operation
				//
				for(i=ifirst; i!=ilast; i+= iinc) {
					//TPZColuna *mydiag = &fDiag[i];
					int64_t offset = Size(i);
					//	TVar val = scratch(i,ic);
					TVar *diag;
					TVar *diaglast = fElem[i];
					TVar *scratchp = &scratch(i-offset+1,ic);
					//val= result(i,ic);
					TVar val = scratch(i,ic);
					val -= *diaglast * result(i,ic);
					res += abs(val*val);
					val = over * val / *diaglast;
					result(i,ic) += val;
					val = result(i,ic);
					diag = fElem[i] + offset-1;
					while( diag > diaglast ) *scratchp++ -= *diag-- * val;
				}
			}
		}
		res = sqrt(res);
	}
	if(residual) {
		this->Residual(result,F,*residual);
	}
	numiterations = it;
	tol = res;
}